

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

precise_unit units::tryUnitPartitioning(string *unit_string,uint64_t match_flags)

{
  double dVar1;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  ulong uVar2;
  bool bVar3;
  const_reference pvVar4;
  reference pvVar5;
  size_type sVar6;
  reference this;
  uint64_t in_RSI;
  int iVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  pair<double,_unsigned_long> pVar9;
  precise_unit pVar10;
  precise_unit bunit_2;
  uint64_t nmatch_flags;
  precise_unit res_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *vd;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  precise_unit bunit_1;
  precise_unit qm2;
  precise_unit res_1;
  size_t start;
  precise_unit temp;
  precise_unit bunit;
  precise_unit res;
  bool hasSep;
  precise_unit possible;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  valid;
  uint64_t minPartitionSize;
  size_t part;
  precise_unit retunit;
  pair<double,_unsigned_long> mret;
  string ustring;
  uint64_t in_stack_00000988;
  string *in_stack_00000990;
  value_type *in_stack_fffffffffffffa68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa70;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffa78;
  undefined7 in_stack_fffffffffffffa80;
  undefined1 in_stack_fffffffffffffa87;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa90;
  string *in_stack_fffffffffffffa98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffaa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffab0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffab8;
  undefined1 *match_flags_00;
  iterator in_stack_fffffffffffffac0;
  bool local_4b1;
  bool local_4a1;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_348;
  undefined1 *local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_300;
  double local_2d0;
  undefined8 local_2c8;
  double local_2a0;
  undefined8 uStack_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_268;
  double local_238;
  undefined8 uStack_230;
  double local_200;
  undefined8 local_1f8;
  ulong local_1d0;
  undefined1 local_1c8 [16];
  double local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1b0;
  double local_188;
  undefined8 local_180;
  double local_158;
  undefined8 local_150;
  double local_128;
  undefined8 local_120;
  byte local_111;
  undefined1 local_110 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_108;
  undefined1 local_100 [24];
  uint64_t local_e8;
  ulong local_c0;
  undefined4 local_b4;
  double local_90;
  undefined8 local_88;
  double local_50;
  unsigned_long local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  uint64_t local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  double local_10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_8;
  precise_unit *ppVar8;
  
  local_20 = in_RSI;
  local_18 = in_RDI;
  std::__cxx11::string::string(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
  pVar9 = getPrefixMultiplierWord(in_stack_fffffffffffffac0._M_current);
  local_48 = pVar9.second;
  local_50 = pVar9.first;
  if ((local_50 != 0.0) || (NAN(local_50))) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (in_stack_fffffffffffffa88,
               CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
               (size_type)in_stack_fffffffffffffa78._M_current);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_fffffffffffffac0._M_current,in_stack_fffffffffffffab8);
    std::__cxx11::string::~string(in_stack_fffffffffffffa70);
    std::__cxx11::string::string(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
    pVar10 = unit_from_string_internal(in_stack_00000990,in_stack_00000988);
    local_88 = pVar10._8_8_;
    local_90 = pVar10.multiplier_;
    std::__cxx11::string::~string(in_stack_fffffffffffffa70);
    bVar3 = is_valid((precise_unit *)CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80));
    if (bVar3) {
      precise_unit::precise_unit
                ((precise_unit *)in_stack_fffffffffffffa70,(double)in_stack_fffffffffffffa68,
                 (precise_unit *)0x7a3fae);
      local_b4 = 1;
    }
    else {
      local_10 = NAN;
      local_8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xfa94a488;
      local_b4 = 1;
    }
    goto LAB_007a521e;
  }
  pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::front
                     (in_stack_fffffffffffffa70);
  local_c0 = (ulong)(*pvVar4 != 'N') * 2 + 1;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (in_stack_fffffffffffffa88,CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80)
             ,(size_type)in_stack_fffffffffffffa78._M_current);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (in_stack_fffffffffffffac0._M_current,in_stack_fffffffffffffab8);
  std::__cxx11::string::~string(in_stack_fffffffffffffa70);
  pvVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::back
                     (in_stack_fffffffffffffa70);
  if (((*pvVar5 == '(') ||
      (pvVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                back(in_stack_fffffffffffffa70), *pvVar5 == '[')) ||
     (pvVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::back
                         (in_stack_fffffffffffffa70), *pvVar5 == '{')) {
    local_c0 = 1;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
              (in_stack_fffffffffffffa70);
  }
  local_e8 = getMinPartitionSize(local_20);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x7a4120);
  local_110 = (undefined1  [8])0x7ff4000000000000;
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xfa94a488;
  local_111 = 0;
LAB_007a4146:
  uVar2 = local_c0;
  sVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (local_18);
  if ((uVar2 < sVar6 - 1) &&
     (sVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                        (local_18), local_e8 <= sVar6 - local_c0)) {
    sVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      (&local_40);
    if (local_e8 <= sVar6) {
      std::__cxx11::string::string(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
      pVar10 = unit_quick_match(in_stack_fffffffffffffac0._M_current,
                                (uint64_t)in_stack_fffffffffffffab8);
      local_120 = pVar10._8_8_;
      local_128 = pVar10.multiplier_;
      std::__cxx11::string::~string(in_stack_fffffffffffffa70);
      bVar3 = is_valid((precise_unit *)CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80)
                      );
      if (((!bVar3) &&
          (sVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   size(&local_40), 2 < sVar6)) &&
         ((pvVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::front(in_stack_fffffffffffffa70), '@' < *pvVar5 &&
          (pvVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::front(in_stack_fffffffffffffa70), *pvVar5 < '[')))) {
        pvVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 operator[](in_stack_fffffffffffffa70,(size_type)in_stack_fffffffffffffa68);
        *pvVar5 = *pvVar5 + ' ';
        std::__cxx11::string::string(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
        pVar10 = unit_quick_match(in_stack_fffffffffffffac0._M_current,
                                  (uint64_t)in_stack_fffffffffffffab8);
        local_150 = pVar10._8_8_;
        local_158 = pVar10.multiplier_;
        local_128 = local_158;
        local_120 = local_150;
        std::__cxx11::string::~string(in_stack_fffffffffffffa70);
      }
      bVar3 = is_valid((precise_unit *)CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80)
                      );
      if (bVar3) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (in_stack_fffffffffffffa88,
                   CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                   (size_type)in_stack_fffffffffffffa78._M_current);
        pVar10 = unit_from_string_internal(in_stack_00000990,in_stack_00000988);
        local_180 = pVar10._8_8_;
        local_188 = pVar10.multiplier_;
        std::__cxx11::string::~string(in_stack_fffffffffffffa70);
        bVar3 = is_valid((precise_unit *)
                         CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80));
        if (bVar3) {
          bVar3 = is_valid((precise_unit *)
                           CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80));
          if (bVar3) {
            pVar10 = precise_unit::operator*
                               ((precise_unit *)in_stack_fffffffffffffa90,
                                (precise_unit *)in_stack_fffffffffffffa88);
            local_1c8._8_8_ = pVar10._8_8_;
            local_1c8._0_8_ = pVar10.multiplier_;
            ppVar8 = (precise_unit *)local_1c8;
            dVar1 = precise_unit::multiplier(ppVar8);
            iVar7 = (int)ppVar8;
            log10(dVar1);
            std::abs(iVar7);
            ppVar8 = (precise_unit *)local_110;
            dVar1 = precise_unit::multiplier(ppVar8);
            iVar7 = (int)ppVar8;
            log10(dVar1);
            std::abs(iVar7);
            if ((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) <
                (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00)) {
              local_110 = (undefined1  [8])local_1c8._0_8_;
              local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_1c8._8_8_;
            }
          }
          else {
            pVar10 = precise_unit::operator*
                               ((precise_unit *)in_stack_fffffffffffffa90,
                                (precise_unit *)in_stack_fffffffffffffa88);
            local_1b0 = pVar10._8_8_;
            local_1b8 = pVar10.multiplier_;
            local_110 = (undefined1  [8])local_1b8;
            local_108 = local_1b0;
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                    in_stack_fffffffffffffa78._M_current);
      }
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
              (in_stack_fffffffffffffa70,(size_type)in_stack_fffffffffffffa68);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
               (char)((ulong)in_stack_fffffffffffffa78._M_current >> 0x38));
    local_c0 = local_c0 + 1;
    pvVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::back
                       (in_stack_fffffffffffffa70);
    if (((*pvVar5 == '(') ||
        (pvVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  back(in_stack_fffffffffffffa70), *pvVar5 == '[')) ||
       (pvVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 back(in_stack_fffffffffffffa70), *pvVar5 == '{')) {
      local_1d0 = local_c0;
      pvVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::back
                         (in_stack_fffffffffffffa70);
      getMatchCharacter(*pvVar5);
      segmentcheck(in_stack_fffffffffffffa98,(char)((ulong)in_stack_fffffffffffffa90 >> 0x38),
                   (size_t *)in_stack_fffffffffffffa88);
      pvVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::back
                         (in_stack_fffffffffffffa70);
      if ((*pvVar5 == '(') &&
         (sVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  find_first_of(in_stack_fffffffffffffa90,(char *)in_stack_fffffffffffffa88,
                                CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80)),
         sVar6 < local_c0)) goto LAB_007a494d;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (in_stack_fffffffffffffa88,
                 CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                 (size_type)in_stack_fffffffffffffa78._M_current);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (in_stack_fffffffffffffac0._M_current,in_stack_fffffffffffffab8);
      std::__cxx11::string::~string(in_stack_fffffffffffffa70);
    }
    do {
      pvVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::back
                         (in_stack_fffffffffffffa70);
      if (*pvVar5 == '_') {
LAB_007a47b9:
        uVar2 = local_c0;
        sVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                size(local_18);
        bVar3 = uVar2 < sVar6 - 1;
      }
      else {
        pvVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 back(in_stack_fffffffffffffa70);
        bVar3 = false;
        if (*pvVar5 == '-') goto LAB_007a47b9;
      }
      if (!bVar3) goto LAB_007a4847;
      local_111 = 1;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                (in_stack_fffffffffffffa70,(size_type)in_stack_fffffffffffffa68);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                 (char)((ulong)in_stack_fffffffffffffa78._M_current >> 0x38));
      local_c0 = local_c0 + 1;
    } while( true );
  }
LAB_007a494d:
  bVar3 = is_valid((precise_unit *)CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80));
  if (bVar3) {
    local_10 = (double)local_110;
    local_8 = local_108;
  }
  else {
    if ((local_e8 < 2) &&
       (pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 back(in_stack_fffffffffffffa70), *pvVar4 == 'm')) {
      std::__cxx11::string::string(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
      pVar10 = unit_quick_match(in_stack_fffffffffffffac0._M_current,
                                (uint64_t)in_stack_fffffffffffffab8);
      local_1f8 = pVar10._8_8_;
      local_200 = pVar10.multiplier_;
      std::__cxx11::string::~string(in_stack_fffffffffffffa70);
      bVar3 = is_valid((precise_unit *)CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80)
                      );
      if (bVar3) {
        pVar10 = precise_unit::operator*
                           ((precise_unit *)in_stack_fffffffffffffa90,
                            (unit *)in_stack_fffffffffffffa88);
        local_8 = pVar10._8_8_;
        local_10 = pVar10.multiplier_;
        goto LAB_007a5200;
      }
    }
    if ((local_e8 < 3) && ((local_111 & 1) == 0)) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (in_stack_fffffffffffffa88,
                 CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                 (size_type)in_stack_fffffffffffffa78._M_current);
      pVar10 = unit_quick_match(in_stack_fffffffffffffac0._M_current,
                                (uint64_t)in_stack_fffffffffffffab8);
      uStack_230 = pVar10._8_8_;
      local_238 = pVar10.multiplier_;
      std::__cxx11::string::~string(in_stack_fffffffffffffa70);
      bVar3 = is_valid((precise_unit *)CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80)
                      );
      if (bVar3) {
        local_268 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)in_stack_fffffffffffffa68);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
        ::__normal_iterator<std::__cxx11::string*>
                  ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)in_stack_fffffffffffffa70,
                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)in_stack_fffffffffffffa68);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (in_stack_fffffffffffffa88,
                   CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                   (size_type)in_stack_fffffffffffffa78._M_current);
        local_290 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    CLI::std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::insert((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa78._M_current,
                             in_stack_fffffffffffffa68);
        std::__cxx11::string::~string(in_stack_fffffffffffffa70);
      }
      else {
        sVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                size(local_18);
        if (sVar6 == 4) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    (in_stack_fffffffffffffa88,
                     CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                     (size_type)in_stack_fffffffffffffa78._M_current);
          pVar10 = unit_quick_match(in_stack_fffffffffffffac0._M_current,
                                    (uint64_t)in_stack_fffffffffffffab8);
          uStack_298 = pVar10._8_8_;
          local_2a0 = pVar10.multiplier_;
          local_238 = local_2a0;
          uStack_230 = uStack_298;
          std::__cxx11::string::~string(in_stack_fffffffffffffa70);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    (in_stack_fffffffffffffa88,
                     CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                     (size_type)in_stack_fffffffffffffa78._M_current);
          pVar10 = unit_from_string_internal(in_stack_00000990,in_stack_00000988);
          local_2c8 = pVar10._8_8_;
          local_2d0 = pVar10.multiplier_;
          std::__cxx11::string::~string(in_stack_fffffffffffffa70);
          bVar3 = is_valid((precise_unit *)
                           CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80));
          if (bVar3) {
            pVar10 = precise_unit::operator*
                               ((precise_unit *)in_stack_fffffffffffffa90,
                                (precise_unit *)in_stack_fffffffffffffa88);
            local_8 = pVar10._8_8_;
            local_10 = pVar10.multiplier_;
            goto LAB_007a5200;
          }
        }
      }
    }
    if ((local_e8 < 2) &&
       ((pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  front(in_stack_fffffffffffffa70), *pvVar4 == 'V' ||
        (pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  front(in_stack_fffffffffffffa70), *pvVar4 == 'A')))) {
      local_300 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffffa68);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffffa70,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffffa68);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (in_stack_fffffffffffffa88,
                 CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                 (size_type)in_stack_fffffffffffffa78._M_current);
      in_stack_fffffffffffffac0 =
           CLI::std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::insert(in_stack_fffffffffffffa70,in_stack_fffffffffffffa78._M_current,
                    in_stack_fffffffffffffa68);
      local_328 = in_stack_fffffffffffffac0._M_current;
      std::__cxx11::string::~string(in_stack_fffffffffffffa70);
    }
    match_flags_00 = local_100;
    local_330 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffa68);
    local_338 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffa68);
    __first._M_current._7_1_ = in_stack_fffffffffffffa87;
    __first._M_current._0_7_ = in_stack_fffffffffffffa80;
    std::
    reverse<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              (__first,in_stack_fffffffffffffa78);
    local_340 = local_100;
    local_348._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffa68);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)in_stack_fffffffffffffa68);
    while (bVar3 = __gnu_cxx::
                   operator==<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffffa70,
                              (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffffa68), ((bVar3 ^ 0xffU) & 1) != 0) {
      this = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_348);
      std::__cxx11::string::string(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
      pVar10 = unit_quick_match(in_stack_fffffffffffffac0._M_current,(uint64_t)match_flags_00);
      in_stack_fffffffffffffaa8 = pVar10._8_8_;
      in_stack_fffffffffffffab0 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pVar10.multiplier_;
      std::__cxx11::string::~string(in_stack_fffffffffffffa70);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size(this);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size(this);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (in_stack_fffffffffffffa88,
                 CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                 (size_type)in_stack_fffffffffffffa78._M_current);
      pVar10 = unit_from_string_internal(in_stack_00000990,in_stack_00000988);
      in_stack_fffffffffffffa88 = pVar10._8_8_;
      ppVar8 = (precise_unit *)pVar10.multiplier_;
      std::__cxx11::string::~string(in_stack_fffffffffffffa70);
      in_stack_fffffffffffffa87 =
           is_valid((precise_unit *)CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80));
      if ((bool)in_stack_fffffffffffffa87) {
        pVar10 = precise_unit::operator*(ppVar8,(precise_unit *)in_stack_fffffffffffffa88);
        in_stack_fffffffffffffa70 = pVar10._8_8_;
        local_10 = pVar10.multiplier_;
        local_8 = in_stack_fffffffffffffa70;
        goto LAB_007a5200;
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_348);
    }
    local_10 = NAN;
    local_8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xfa94a488;
  }
LAB_007a5200:
  local_b4 = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80));
LAB_007a521e:
  std::__cxx11::string::~string(in_stack_fffffffffffffa70);
  pVar10._8_8_ = local_8;
  pVar10.multiplier_ = local_10;
  return pVar10;
LAB_007a4847:
  pvVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::back
                     (in_stack_fffffffffffffa70);
  bVar3 = isDigitCharacter(*pvVar5);
  if (bVar3) {
    while( true ) {
      uVar2 = local_c0;
      sVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                        (local_18);
      local_4a1 = false;
      if (uVar2 < sVar6 - 1) {
        pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 operator[](in_stack_fffffffffffffa70,(size_type)in_stack_fffffffffffffa68);
        local_4b1 = true;
        if (*pvVar4 != '.') {
          pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   operator[](in_stack_fffffffffffffa70,(size_type)in_stack_fffffffffffffa68);
          local_4b1 = isDigitCharacter(*pvVar4);
        }
        local_4a1 = local_4b1;
      }
      if (local_4a1 == false) break;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                (in_stack_fffffffffffffa70,(size_type)in_stack_fffffffffffffa68);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                 (char)((ulong)in_stack_fffffffffffffa78._M_current >> 0x38));
      local_c0 = local_c0 + 1;
    }
  }
  goto LAB_007a4146;
}

Assistant:

static precise_unit tryUnitPartitioning(
    const std::string& unit_string,
    std::uint64_t match_flags)
{
    std::string ustring = unit_string;

    auto mret = getPrefixMultiplierWord(unit_string);
    if (mret.first != 0.0) {
        ustring = unit_string.substr(mret.second);

        auto retunit = unit_from_string_internal(ustring, match_flags);
        if (is_valid(retunit)) {
            return {mret.first, retunit};
        }
        return precise::invalid;
    }

    // a newton(N) in front is somewhat common
    // try a round with just a quick partition
    size_t part = (unit_string.front() == 'N') ? 1 : 3;
    ustring = unit_string.substr(0, part);
    if (ustring.back() == '(' || ustring.back() == '[' ||
        ustring.back() == '{') {
        part = 1;
        ustring.pop_back();
    }
    auto minPartitionSize = getMinPartitionSize(match_flags);
    std::vector<std::string> valid;
    precise_unit possible = precise::invalid;
    bool hasSep{false};
    while (part < unit_string.size() - 1) {
        if (unit_string.size() - part < minPartitionSize) {
            break;
        }
        if (ustring.size() >= minPartitionSize) {
            auto res = unit_quick_match(ustring, match_flags);
            if (!is_valid(res) && ustring.size() >= 3) {
                if (ustring.front() >= 'A' &&
                    ustring.front() <= 'Z') {  // check the lower case version
                                               // since we skipped partitioning
                                               // when we did this earlier
                    ustring[0] += 32;
                    res = unit_quick_match(ustring, match_flags);
                }
            }
            if (is_valid(res)) {
                auto bunit = unit_from_string_internal(
                    unit_string.substr(part),
                    match_flags | skip_partition_check);
                if (is_valid(bunit)) {
                    if (!is_valid(possible)) {
                        possible = res * bunit;
                    } else {
                        auto temp = res * bunit;
                        if (std::abs(log10(temp.multiplier())) <
                            std::abs(log10(possible.multiplier()))) {
                            possible = temp;
                        }
                    }
                }
                valid.push_back(ustring);
            }
        }
        ustring.push_back(unit_string[part]);
        ++part;
        if (ustring.back() == '(' || ustring.back() == '[' ||
            ustring.back() == '{') {
            auto start = part;
            segmentcheck(unit_string, getMatchCharacter(ustring.back()), part);
            if (ustring.back() == '(') {
                if (unit_string.find_first_of("({[*/", start) < part) {
                    // this implies that the contents of the parenthesis
                    // must be a standalone segment and should not be
                    // included in a check
                    break;
                }
            }
            ustring = unit_string.substr(0, part);
        }
        while ((ustring.back() == '_' || ustring.back() == '-') &&
               (part < unit_string.size() - 1)) {
            hasSep = true;
            ustring.push_back(unit_string[part]);
            ++part;
        }
        if (isDigitCharacter(ustring.back())) {
            while ((part < unit_string.size() - 1) &&
                   (unit_string[part] == '.' ||
                    isDigitCharacter(unit_string[part]))) {
                ustring.push_back(unit_string[part]);
                ++part;
            }
        }
    }
    if (is_valid(possible)) {
        return possible;
    }
    if (minPartitionSize <= 1) {
        // meter is somewhat common ending so just check that one too
        if (unit_string.back() == 'm') {
            auto res = unit_quick_match(ustring, match_flags);
            if (is_valid(res)) {
                return res * m;
            }
        }
    }
    if (minPartitionSize <= 2 && !hasSep) {
        // now do a quick check with a 2 character string since we skipped that
        // earlier
        auto qm2 = unit_quick_match(unit_string.substr(0, 2), match_flags);
        if (is_valid(qm2)) {
            valid.insert(valid.begin(), unit_string.substr(0, 2));
        } else if (unit_string.size() == 4) {  // length of 4 is a bit odd so
                                               // check the back two characters
                                               // for a quick match
            qm2 = unit_quick_match(unit_string.substr(2, 2), match_flags);
            auto bunit = unit_from_string_internal(
                unit_string.substr(0, 2), match_flags);
            if (is_valid(bunit)) {
                return qm2 * bunit;
            }
        }
    }
    if (minPartitionSize <= 1) {
        // now pick off a couple 1 character units
        if (unit_string.front() == 'V' || unit_string.front() == 'A') {
            valid.insert(valid.begin(), unit_string.substr(0, 1));
        }
    }
    // start with the biggest
    std::reverse(valid.begin(), valid.end());
    for (auto& vd : valid) {
        auto res = unit_quick_match(vd, match_flags);
        auto nmatch_flags = (vd.size() > 3) ?
            match_flags :
            match_flags | minimum_partition_size3;
        auto bunit = unit_from_string_internal(
            unit_string.substr(vd.size()), nmatch_flags);
        if (is_valid(bunit)) {
            return res * bunit;
        }
    }

    return precise::invalid;
}